

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O3

uint32_t mp_sizeof_array(uint32_t size)

{
  uint32_t uVar1;
  
  uVar1 = 1;
  if (0xf < size) {
    uVar1 = (0xffff < size) + 3 + (uint)(0xffff < size);
  }
  return uVar1;
}

Assistant:

MP_IMPL uint32_t
mp_sizeof_array(uint32_t size)
{
	if (size <= 15) {
		return 1;
	} else if (size <= UINT16_MAX) {
		return 1 + sizeof(uint16_t);
	} else {
		return 1 + sizeof(uint32_t);
	}
}